

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O1

void __thiscall State::AddValidation(State *this,Edge *edge,StringPiece path,uint64_t slash_bits)

{
  pointer *pppNVar1;
  iterator __position;
  Node *node;
  Node *local_10;
  
  local_10 = GetNode(this,path,slash_bits);
  __position._M_current =
       (edge->validations_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (edge->validations_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
              ((vector<Node*,std::allocator<Node*>> *)&edge->validations_,__position,&local_10);
  }
  else {
    *__position._M_current = local_10;
    pppNVar1 = &(edge->validations_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  Node::AddValidationOutEdge(local_10,edge);
  return;
}

Assistant:

void State::AddValidation(Edge* edge, StringPiece path, uint64_t slash_bits) {
  Node* node = GetNode(path, slash_bits);
  edge->validations_.push_back(node);
  node->AddValidationOutEdge(edge);
}